

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureCompareFuncCase::test
          (TextureCompareFuncCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  bool bVar1;
  deBool dVar2;
  TestLog *pTVar3;
  Enum<int,_2UL> EVar4;
  bool local_451;
  GetNameFunc local_440;
  int local_438;
  string local_430;
  allocator<char> local_409;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  GLenum local_388;
  int local_384;
  deUint32 err_3;
  int ndx_2;
  int local_378;
  GetNameFunc local_370;
  int local_368;
  string local_360;
  allocator<char> local_339;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  GLenum local_2b8;
  int local_2b4;
  deUint32 err_2;
  int ndx_1;
  int local_2a8;
  GetNameFunc local_2a0;
  int local_298;
  string local_290;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  GLenum local_1e8;
  GLuint local_1e4;
  deUint32 err_1;
  GLuint value_1;
  int local_1d8;
  GetNameFunc local_1d0;
  int local_1c8;
  string local_1c0;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  GLenum local_114;
  GLint local_110;
  deUint32 err;
  GLint value;
  int ndx;
  GLenum compareFuncs [8];
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  ScopedLogSection local_98;
  ScopedLogSection section_1;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ScopedLogSection local_30;
  ScopedLogSection section;
  bool isPureCase;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  TextureCompareFuncCase *this_local;
  
  bVar1 = isPureIntTester((this->super_TextureTest).m_tester);
  local_451 = true;
  if (!bVar1) {
    local_451 = isPureUintTester((this->super_TextureTest).m_tester);
  }
  section.m_log._7_1_ = local_451;
  if (local_451 == false) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Initial",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_30,pTVar3,&local_50,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x203,
               (this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_30);
  }
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Set",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Set",(allocator<char> *)((long)compareFuncs + 0x1f));
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar3,&local_b8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)compareFuncs + 0x1f));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  _value = 0x20600000203;
  compareFuncs[0] = 0x201;
  compareFuncs[1] = 0x204;
  compareFuncs[2] = 0x202;
  compareFuncs[3] = 0x205;
  compareFuncs[4] = 0x207;
  compareFuncs[5] = 0x200;
  if ((section.m_log._7_1_ & 1) == 0) {
    for (local_2b4 = 0; local_2b4 < 8; local_2b4 = local_2b4 + 1) {
      glu::CallLogWrapper::glTexParameteri
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 (&value)[local_2b4]);
      do {
        local_2b8 = glu::CallLogWrapper::glGetError(gl);
        if (local_2b8 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_338,"Got Error ",&local_339);
          EVar4 = glu::getErrorStr(local_2b8);
          _err_3 = EVar4.m_getName;
          local_378 = EVar4.m_value;
          local_370 = _err_3;
          local_368 = local_378;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_360,&local_370);
          std::operator+(&local_318,&local_338,&local_360);
          std::operator+(&local_2f8,&local_318,": ");
          std::operator+(&local_2d8,&local_2f8,"glTexParameteri");
          tcu::ResultCollector::fail(result,&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::~string((string *)&local_360);
          std::__cxx11::string::~string((string *)&local_338);
          std::allocator<char>::~allocator(&local_339);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      StateQueryUtil::verifyStateTextureParamInteger
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 (&value)[local_2b4],(this->super_TextureTest).m_type);
    }
    for (local_384 = 0; local_384 < 8; local_384 = local_384 + 1) {
      glu::CallLogWrapper::glTexParameterf
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 (float)(uint)(&value)[local_384]);
      do {
        local_388 = glu::CallLogWrapper::glGetError(gl);
        if (local_388 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,"Got Error ",&local_409);
          EVar4 = glu::getErrorStr(local_388);
          local_440 = EVar4.m_getName;
          local_438 = EVar4.m_value;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_430,&local_440);
          std::operator+(&local_3e8,&local_408,&local_430);
          std::operator+(&local_3c8,&local_3e8,": ");
          std::operator+(&local_3a8,&local_3c8,"glTexParameterf");
          tcu::ResultCollector::fail(result,&local_3a8);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&local_408);
          std::allocator<char>::~allocator(&local_409);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      StateQueryUtil::verifyStateTextureParamInteger
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 (&value)[local_384],(this->super_TextureTest).m_type);
    }
  }
  else {
    for (err = 0; (int)err < 8; err = err + 1) {
      bVar1 = isPureIntTester((this->super_TextureTest).m_tester);
      if (bVar1) {
        local_110 = (&value)[(int)err];
        glu::CallLogWrapper::glTexParameterIiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   &local_110);
        do {
          local_114 = glu::CallLogWrapper::glGetError(gl);
          if (local_114 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_198,"Got Error ",&local_199);
            EVar4 = glu::getErrorStr(local_114);
            _err_1 = EVar4.m_getName;
            local_1d8 = EVar4.m_value;
            local_1d0 = _err_1;
            local_1c8 = local_1d8;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1c0,&local_1d0);
            std::operator+(&local_178,&local_198,&local_1c0);
            std::operator+(&local_158,&local_178,": ");
            std::operator+(&local_138,&local_158,"glTexParameterIiv");
            tcu::ResultCollector::fail(result,&local_138);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_198);
            std::allocator<char>::~allocator(&local_199);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
      }
      else {
        local_1e4 = (&value)[(int)err];
        glu::CallLogWrapper::glTexParameterIuiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   &local_1e4);
        do {
          local_1e8 = glu::CallLogWrapper::glGetError(gl);
          if (local_1e8 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_268,"Got Error ",&local_269);
            EVar4 = glu::getErrorStr(local_1e8);
            _err_2 = EVar4.m_getName;
            local_2a8 = EVar4.m_value;
            local_2a0 = _err_2;
            local_298 = local_2a8;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_2a0);
            std::operator+(&local_248,&local_268,&local_290);
            std::operator+(&local_228,&local_248,": ");
            std::operator+(&local_208,&local_228,"glTexParameterIuiv");
            tcu::ResultCollector::fail(result,&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_228);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_290);
            std::__cxx11::string::~string((string *)&local_268);
            std::allocator<char>::~allocator(&local_269);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 (&value)[(int)err],(this->super_TextureTest).m_type);
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_98);
  return;
}

Assistant:

void TextureCompareFuncCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool isPureCase = isPureIntTester(m_tester) || isPureUintTester(m_tester);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_LEQUAL, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const GLenum				compareFuncs[]	= {GL_LEQUAL, GL_GEQUAL, GL_LESS, GL_GREATER, GL_EQUAL, GL_NOTEQUAL, GL_ALWAYS, GL_NEVER};

		if (isPureCase)
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(compareFuncs); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)compareFuncs[ndx];
					gl.glTexParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = compareFuncs[ndx];
					gl.glTexParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
				}

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, compareFuncs[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(compareFuncs); ++ndx)
			{
				gl.glTexParameteri(m_target, m_pname, compareFuncs[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, compareFuncs[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(compareFuncs); ++ndx)
			{
				gl.glTexParameterf(m_target, m_pname, (GLfloat)compareFuncs[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, compareFuncs[ndx], m_type);
			}
		}
	}
}